

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_listener_free(void *arg)

{
  nni_list *list;
  void *item;
  
  ws_listener_stop(arg);
  nni_cv_fini((nni_cv *)((long)arg + 0x88));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x60));
  nni_strfree(*(char **)((long)arg + 0x58));
  list = (nni_list *)((long)arg + 0x130);
  item = nni_list_first(list);
  while (item != (void *)0x0) {
    nni_list_remove(list,item);
    nni_strfree(*(char **)((long)item + 0x10));
    nni_strfree(*(char **)((long)item + 0x18));
    nni_free(item,0x20);
    item = nni_list_first(list);
  }
  if (*(nng_url **)((long)arg + 0x108) != (nng_url *)0x0) {
    nng_url_free(*(nng_url **)((long)arg + 0x108));
  }
  nni_free(arg,0x160);
  return;
}

Assistant:

static void
ws_listener_free(void *arg)
{
	nni_ws_listener *l = arg;
	ws_header       *hdr;

	ws_listener_stop(l);

	nni_cv_fini(&l->cv);
	nni_mtx_fini(&l->mtx);
	nni_strfree(l->proto);
	while ((hdr = nni_list_first(&l->headers)) != NULL) {
		nni_list_remove(&l->headers, hdr);
		nni_strfree(hdr->name);
		nni_strfree(hdr->value);
		NNI_FREE_STRUCT(hdr);
	}
	if (l->url) {
		nng_url_free(l->url);
	}
	NNI_FREE_STRUCT(l);
}